

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

void __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::QuantParam,_aom_rc_mode>
::~CartesianProductGenerator
          (CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::QuantParam,_aom_rc_mode>
           *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->
  super_ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::QuantParam,_aom_rc_mode>_>
  )._vptr_ParamGeneratorInterface = (_func_int **)&PTR__CartesianProductGenerator_010128a0;
  p_Var1 = (this->generators_).
           super__Tuple_impl<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::QuantParam>,_testing::internal::ParamGenerator<aom_rc_mode>_>
           .
           super__Head_base<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_false>
           ._M_head_impl.impl_.
           super___shared_ptr<const_testing::internal::ParamGeneratorInterface<const_libaom_test::CodecFactory_*>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(this->generators_).
                   super__Tuple_impl<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::QuantParam>,_testing::internal::ParamGenerator<aom_rc_mode>_>
                   .
                   super__Tuple_impl<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::QuantParam>,_testing::internal::ParamGenerator<aom_rc_mode>_>
                   .
                   super__Head_base<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_false>
                   ._M_head_impl.impl_.
                   super___shared_ptr<const_testing::internal::ParamGeneratorInterface<libaom_test::TestMode>,_(__gnu_cxx::_Lock_policy)2>
           + 8))->_M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(this->generators_).
                   super__Tuple_impl<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::QuantParam>,_testing::internal::ParamGenerator<aom_rc_mode>_>
                   .
                   super__Tuple_impl<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::QuantParam>,_testing::internal::ParamGenerator<aom_rc_mode>_>
                   .
                   super__Tuple_impl<2UL,_testing::internal::ParamGenerator<(anonymous_namespace)::QuantParam>,_testing::internal::ParamGenerator<aom_rc_mode>_>
                   .
                   super__Head_base<2UL,_testing::internal::ParamGenerator<(anonymous_namespace)::QuantParam>,_false>
                   ._M_head_impl.impl_ + 8))->_M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(this->generators_).
                   super__Tuple_impl<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::QuantParam>,_testing::internal::ParamGenerator<aom_rc_mode>_>
                   .
                   super__Tuple_impl<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::QuantParam>,_testing::internal::ParamGenerator<aom_rc_mode>_>
                   .
                   super__Tuple_impl<2UL,_testing::internal::ParamGenerator<(anonymous_namespace)::QuantParam>,_testing::internal::ParamGenerator<aom_rc_mode>_>
                   .super__Tuple_impl<3UL,_testing::internal::ParamGenerator<aom_rc_mode>_>.
                   super__Head_base<3UL,_testing::internal::ParamGenerator<aom_rc_mode>,_false>.
                   _M_head_impl + 8))->_M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    return;
  }
  return;
}

Assistant:

~CartesianProductGenerator() override {}